

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_tree.cc
# Opt level: O0

void memory_tree_ns::route_to_leaf
               (memory_tree *b,single_learner *base,uint32_t *ec_array_index,uint32_t cn,
               v_array<unsigned_int> *path,bool insertion)

{
  float prediction_00;
  example *peVar1;
  example **ppeVar2;
  node *pnVar3;
  size_t sVar4;
  uint in_ECX;
  uint *in_RDX;
  example *in_RSI;
  long in_RDI;
  byte in_R9B;
  float prediction;
  labels preds;
  labels multilabels;
  uint32_t save_multi_pred;
  label_t mc;
  example *ec;
  uint32_t in_stack_00000134;
  single_learner *in_stack_00000138;
  memory_tree *in_stack_00000140;
  uint *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  uint32_t in_stack_ffffffffffffff54;
  example *ec_00;
  example *this;
  float *local_88;
  float *local_80;
  float *local_78;
  size_t local_70;
  label_t local_68;
  wclass *local_60;
  wclass *local_58;
  size_t local_50;
  float local_44;
  label_t local_40;
  uint local_1c;
  
  ppeVar2 = v_array<example_*>::operator[]((v_array<example_*> *)(in_RDI + 0x28),(ulong)*in_RDX);
  peVar1 = *ppeVar2;
  local_44 = 0.0;
  if (*(int *)(in_RDI + 0xcc) == 0) {
    local_40 = (peVar1->l).multi;
    local_44 = (peVar1->pred).scalar;
  }
  else {
    local_68 = (peVar1->l).multi;
    local_60 = (peVar1->l).cs.costs._end;
    local_58 = (peVar1->l).cs.costs.end_array;
    local_50 = (peVar1->l).cs.costs.erase_count;
    local_88 = (peVar1->pred).scalars._begin;
    local_80 = (peVar1->pred).scalars._end;
    local_78 = (peVar1->pred).scalars.end_array;
    local_70 = (peVar1->pred).scalars.erase_count;
  }
  v_array<unsigned_int>::clear
            ((v_array<unsigned_int> *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50))
  ;
  (peVar1->l).cs.costs._begin = (wclass *)0x3f8000007f7fffff;
  (peVar1->l).simple.initial = 0.0;
  local_1c = in_ECX;
  while (pnVar3 = v_array<memory_tree_ns::node>::operator[]
                            ((v_array<memory_tree_ns::node> *)(in_RDI + 8),(ulong)local_1c),
        pnVar3->internal != -1) {
    v_array<unsigned_int>::push_back
              ((v_array<unsigned_int> *)
               CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
               in_stack_ffffffffffffff48);
    ec_00 = in_RSI;
    this = peVar1;
    v_array<memory_tree_ns::node>::operator[]
              ((v_array<memory_tree_ns::node> *)(in_RDI + 8),(ulong)local_1c);
    LEARNER::learner<char,_example>::predict
              ((learner<char,_example> *)this,ec_00,
               CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
    prediction_00 = (peVar1->pred).scalar;
    if ((in_R9B & 1) == 0) {
      if (0.0 <= prediction_00) {
        pnVar3 = v_array<memory_tree_ns::node>::operator[]
                           ((v_array<memory_tree_ns::node> *)(in_RDI + 8),(ulong)local_1c);
        in_stack_ffffffffffffff54 = pnVar3->right;
        local_1c = in_stack_ffffffffffffff54;
      }
      else {
        pnVar3 = v_array<memory_tree_ns::node>::operator[]
                           ((v_array<memory_tree_ns::node> *)(in_RDI + 8),(ulong)local_1c);
        in_stack_ffffffffffffff54 = pnVar3->left;
        local_1c = in_stack_ffffffffffffff54;
      }
    }
    else {
      pnVar3 = v_array<memory_tree_ns::node>::operator[]
                         ((v_array<memory_tree_ns::node> *)(in_RDI + 8),(ulong)local_1c);
      local_1c = insert_descent(pnVar3,prediction_00);
    }
  }
  v_array<unsigned_int>::push_back
            ((v_array<unsigned_int> *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
             in_stack_ffffffffffffff48);
  if (*(int *)(in_RDI + 0xcc) == 0) {
    (peVar1->l).multi = local_40;
    (peVar1->pred).scalar = local_44;
  }
  else {
    (peVar1->pred).scalars._begin = local_88;
    (peVar1->pred).scalars._end = local_80;
    (peVar1->pred).scalars.end_array = local_78;
    (peVar1->pred).scalars.erase_count = local_70;
    (peVar1->l).multi = local_68;
    (peVar1->l).cs.costs._end = local_60;
    (peVar1->l).cs.costs.end_array = local_58;
    (peVar1->l).cs.costs.erase_count = local_50;
  }
  if ((in_R9B & 1) == 1) {
    v_array<memory_tree_ns::node>::operator[]
              ((v_array<memory_tree_ns::node> *)(in_RDI + 8),(ulong)local_1c);
    v_array<unsigned_int>::push_back
              ((v_array<unsigned_int> *)
               CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
               in_stack_ffffffffffffff48);
    pnVar3 = v_array<memory_tree_ns::node>::operator[]
                       ((v_array<memory_tree_ns::node> *)(in_RDI + 8),(ulong)local_1c);
    sVar4 = v_array<unsigned_int>::size(&pnVar3->examples_index);
    if ((*(ulong *)(in_RDI + 0x48) <= sVar4) &&
       (sVar4 = v_array<memory_tree_ns::node>::size((v_array<memory_tree_ns::node> *)(in_RDI + 8)),
       sVar4 + 2 < *(ulong *)(in_RDI + 0x50))) {
      split_leaf(in_stack_00000140,in_stack_00000138,in_stack_00000134);
    }
  }
  return;
}

Assistant:

void route_to_leaf(memory_tree& b, single_learner& base, const uint32_t & ec_array_index, uint32_t cn, v_array<uint32_t>& path, bool insertion){
		example& ec = *b.examples[ec_array_index];
        
        MULTICLASS::label_t mc;
        uint32_t save_multi_pred = 0;
        MULTILABEL::labels multilabels;
        MULTILABEL::labels preds;
        if (b.oas == false){
            mc = ec.l.multi;
            save_multi_pred = ec.pred.multiclass;
        }
        else{
            multilabels = ec.l.multilabels;
            preds = ec.pred.multilabels;
        }

        path.clear();
	    ec.l.simple = {FLT_MAX, 1.0, 0.0};
		while(b.nodes[cn].internal != -1){
			path.push_back(cn);  //path stores node id from the root to the leaf
			base.predict(ec, b.nodes[cn].base_router);
			float prediction = ec.pred.scalar;
			if (insertion == false)
				cn = prediction < 0 ? b.nodes[cn].left : b.nodes[cn].right;
			else
			    cn = insert_descent(b.nodes[cn], prediction);
		}
		path.push_back(cn); //push back the leaf 
        
        if (b.oas == false){
            ec.l.multi = mc; 
            ec.pred.multiclass = save_multi_pred;
        }
        else{
            ec.pred.multilabels = preds;
            ec.l.multilabels = multilabels;
        }

        //cout<<"at route to leaf: "<<path.size()<<endl;
		if (insertion == true){
			b.nodes[cn].examples_index.push_back(ec_array_index);
			if ((b.nodes[cn].examples_index.size() >= b.max_leaf_examples) && (b.nodes.size() + 2 < b.max_nodes))
				split_leaf(b,base,cn);
		}
	}